

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_union.cpp
# Opt level: O2

void __thiscall
duckdb::PhysicalUnion::PhysicalUnion
          (PhysicalUnion *this,vector<duckdb::LogicalType,_true> *types,PhysicalOperator *top,
          PhysicalOperator *bottom,idx_t estimated_cardinality,bool allow_out_of_order)

{
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *this_00;
  pointer pLVar1;
  pointer pLVar2;
  pointer pLVar3;
  reference_wrapper<duckdb::PhysicalOperator> local_50;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  
  pLVar1 = (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pLVar2 = (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar3 = (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_PhysicalOperator)._vptr_PhysicalOperator =
       (_func_int **)&PTR__PhysicalOperator_0279ecb0;
  (this->super_PhysicalOperator).type = UNION;
  (this->super_PhysicalOperator).children.
  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &(this->super_PhysicalOperator).children;
  (this->super_PhysicalOperator).children.
  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_PhysicalOperator).children.
  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_PhysicalOperator).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = pLVar2;
  (this->super_PhysicalOperator).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = pLVar3;
  (this->super_PhysicalOperator).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pLVar1;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_PhysicalOperator).estimated_cardinality = estimated_cardinality;
  (this->super_PhysicalOperator).sink_state.
  super_unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t.
  super___uniq_ptr_impl<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>.
  super__Head_base<0UL,_duckdb::GlobalSinkState_*,_false>._M_head_impl = (GlobalSinkState *)0x0;
  (this->super_PhysicalOperator).op_state.
  super_unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalOperatorState_*,_std::default_delete<duckdb::GlobalOperatorState>_>
  .super__Head_base<0UL,_duckdb::GlobalOperatorState_*,_false>._M_head_impl =
       (GlobalOperatorState *)0x0;
  (this->super_PhysicalOperator).lock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->super_PhysicalOperator).lock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->super_PhysicalOperator).lock.super___mutex_base._M_mutex + 0x10) = 0
  ;
  (this->super_PhysicalOperator).lock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->super_PhysicalOperator).lock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
  (this->super_PhysicalOperator)._vptr_PhysicalOperator =
       (_func_int **)&PTR__PhysicalOperator_027c7be8;
  this->allow_out_of_order = allow_out_of_order;
  local_50._M_data = top;
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
  ::emplace_back<std::reference_wrapper<duckdb::PhysicalOperator>>
            ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
              *)this_00,&local_50);
  local_50._M_data = bottom;
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
  ::emplace_back<std::reference_wrapper<duckdb::PhysicalOperator>>
            ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
              *)this_00,&local_50);
  return;
}

Assistant:

PhysicalUnion::PhysicalUnion(vector<LogicalType> types, PhysicalOperator &top, PhysicalOperator &bottom,
                             idx_t estimated_cardinality, bool allow_out_of_order)
    : PhysicalOperator(PhysicalOperatorType::UNION, std::move(types), estimated_cardinality),
      allow_out_of_order(allow_out_of_order) {
	children.push_back(top);
	children.push_back(bottom);
}